

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  int local_14;
  int n;
  ImDrawDataBuilder *this_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    ImVector<ImDrawList_*>::resize(this->Layers + local_14,0);
  }
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }